

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool google::protobuf::internal::MapFieldPrinterHelper::SortMap
               (Message *message,Reflection *reflection,FieldDescriptor *field,
               MessageFactory *factory,
               vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               *sorted_map_field)

{
  pointer *pppMVar1;
  iterator iVar2;
  __normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
  __first;
  __normal_iterator<const_google::protobuf::Message_**,_std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>_>
  __last;
  _Iter_comp_iter<google::protobuf::MapEntryMessageComparator> __comp;
  bool bVar3;
  int iVar4;
  int iVar5;
  MapFieldBase *this;
  void *pvVar6;
  undefined4 extraout_var;
  Descriptor *pDVar7;
  Message **__buffer;
  long lVar8;
  pair<const_google::protobuf::Message_**,_long> pVar9;
  MapIterator iter;
  Message *map_entry_message;
  MapIterator local_90;
  MapIterator local_60;
  
  this = Reflection::GetMapData(reflection,message,field);
  bVar3 = MapFieldBase::IsRepeatedFieldValid(this);
  if (bVar3) {
    pvVar6 = Reflection::GetRawRepeatedField
                       (reflection,message,field,CPPTYPE_MESSAGE,-1,(Descriptor *)0x0);
    if (0 < *(int *)((long)pvVar6 + 8)) {
      lVar8 = 0;
      do {
        local_90.iter_ = *(void **)(*(long *)((long)pvVar6 + 0x10) + 8 + lVar8 * 8);
        iVar2._M_current =
             (sorted_map_field->
             super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (sorted_map_field->
            super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
          ::_M_realloc_insert<google::protobuf::Message_const*>
                    ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                      *)sorted_map_field,iVar2,(Message **)&local_90);
        }
        else {
          *iVar2._M_current = (Message *)local_90.iter_;
          pppMVar1 = &(sorted_map_field->
                      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppMVar1 = *pppMVar1 + 1;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < *(int *)((long)pvVar6 + 8));
    }
  }
  else {
    pDVar7 = FieldDescriptor::message_type(field);
    iVar4 = (*factory->_vptr_MessageFactory[2])(factory);
    Reflection::MapBegin(&local_90,reflection,message,field);
    while( true ) {
      Reflection::MapEnd(&local_60,reflection,message,field);
      iVar5 = (*(local_90.map_)->_vptr_MapFieldBase[5])(local_90.map_,&local_90,&local_60);
      MapIterator::~MapIterator(&local_60);
      if ((char)iVar5 != '\0') break;
      local_60.iter_ = (void *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x18))();
      CopyKey(&local_90.key_,(Message *)local_60.iter_,*(FieldDescriptor **)(pDVar7 + 0x28));
      CopyValue(&local_90.value_,(Message *)local_60.iter_,
                (FieldDescriptor *)(*(long *)(pDVar7 + 0x28) + 0x98));
      iVar2._M_current =
           (sorted_map_field->
           super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (sorted_map_field->
          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>::
        _M_realloc_insert<google::protobuf::Message_const*const&>
                  ((vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>
                    *)sorted_map_field,iVar2,(Message **)&local_60);
      }
      else {
        *iVar2._M_current = (Message *)local_60.iter_;
        pppMVar1 = &(sorted_map_field->
                    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppMVar1 = *pppMVar1 + 1;
      }
      (*(local_90.map_)->_vptr_MapFieldBase[0x12])(local_90.map_,&local_90);
    }
    MapIterator::~MapIterator(&local_90);
  }
  pDVar7 = FieldDescriptor::message_type(field);
  __first._M_current =
       (sorted_map_field->
       super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (sorted_map_field->
       super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    __comp._M_comp.field_ = *(MapEntryMessageComparator *)(pDVar7 + 0x28);
    lVar8 = (long)__last._M_current - (long)__first._M_current >> 3;
    pVar9 = std::get_temporary_buffer<google::protobuf::Message_const*>
                      ((lVar8 - (lVar8 + 1 >> 0x3f)) + 1 >> 1);
    __buffer = pVar9.first;
    if (__buffer == (Message **)0x0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<google::protobuf::Message_const**,std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::MapEntryMessageComparator>>
                (__first,__last,__comp);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<google::protobuf::Message_const**,std::vector<google::protobuf::Message_const*,std::allocator<google::protobuf::Message_const*>>>,google::protobuf::Message_const**,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::MapEntryMessageComparator>>
                (__first,__last,__buffer,pVar9.second,__comp);
    }
    operator_delete(__buffer);
  }
  return !bVar3;
}

Assistant:

bool MapFieldPrinterHelper::SortMap(
    const Message& message, const Reflection* reflection,
    const FieldDescriptor* field, MessageFactory* factory,
    std::vector<const Message*>* sorted_map_field) {
  bool need_release = false;
  const MapFieldBase& base = *reflection->GetMapData(message, field);

  if (base.IsRepeatedFieldValid()) {
    const RepeatedPtrField<Message>& map_field =
        reflection->GetRepeatedPtrField<Message>(message, field);
    for (int i = 0; i < map_field.size(); ++i) {
      sorted_map_field->push_back(
          const_cast<RepeatedPtrField<Message>*>(&map_field)->Mutable(i));
    }
  } else {
    // TODO(teboring): For performance, instead of creating map entry message
    // for each element, just store map keys and sort them.
    const Descriptor* map_entry_desc = field->message_type();
    const Message* prototype = factory->GetPrototype(map_entry_desc);
    for (MapIterator iter =
             reflection->MapBegin(const_cast<Message*>(&message), field);
         iter != reflection->MapEnd(const_cast<Message*>(&message), field);
         ++iter) {
      Message* map_entry_message = prototype->New();
      CopyKey(iter.GetKey(), map_entry_message, map_entry_desc->field(0));
      CopyValue(iter.GetValueRef(), map_entry_message,
                map_entry_desc->field(1));
      sorted_map_field->push_back(map_entry_message);
    }
    need_release = true;
  }

  MapEntryMessageComparator comparator(field->message_type());
  std::stable_sort(sorted_map_field->begin(), sorted_map_field->end(),
                   comparator);
  return need_release;
}